

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocations.h
# Opt level: O0

void * ZSTD_customCalloc(size_t size,ZSTD_customMem customMem)

{
  void *ptr;
  size_t size_local;
  
  if (customMem.customAlloc == (ZSTD_allocFunction)0x0) {
    size_local = (size_t)calloc(1,size);
  }
  else {
    size_local = (size_t)(*customMem.customAlloc)(customMem.opaque,size);
    memset((void *)size_local,0,size);
  }
  return (void *)size_local;
}

Assistant:

MEM_STATIC void* ZSTD_customCalloc(size_t size, ZSTD_customMem customMem)
{
    if (customMem.customAlloc) {
        /* calloc implemented as malloc+memset;
         * not as efficient as calloc, but next best guess for custom malloc */
        void* const ptr = customMem.customAlloc(customMem.opaque, size);
        ZSTD_memset(ptr, 0, size);
        return ptr;
    }
    return ZSTD_calloc(1, size);
}